

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O3

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CIdExp *exp)

{
  CPrintVisitor *this_00;
  string local_78;
  string local_58;
  string local_38;
  
  this->lastVisited = this->lastVisited + 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(exp->name)._M_dataplus._M_p,(exp->name)._M_string_length);
  this_00 = (CPrintVisitor *)(exp->name)._M_dataplus._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,this_00,
             (pointer)((long)&(this_00->super_IVisitor)._vptr_IVisitor +
                      (exp->name)._M_string_length));
  ConstructLabel(&local_38,this_00,&local_58,this->lastVisited);
  std::__cxx11::string::operator=((string *)&this->description,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  AddArrow(this,this->lastVisited);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"IdExp","");
  AddLabel(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  this->lastVisited = this->lastVisited + 1;
  return;
}

Assistant:

void CPrintVisitor::Visit(CIdExp &exp) {
	++lastVisited;
	std::cout << exp.name;
	this->description = ConstructLabel(exp.name, lastVisited);
	AddArrow(lastVisited);
	AddLabel("IdExp");
	++lastVisited;
}